

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O0

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
                  *this,service *srv,int backlog)

{
  io_service *piVar1;
  acceptor *this_00;
  _func_int **in_RSI;
  acceptor *in_RDI;
  
  acceptor::acceptor(in_RDI);
  in_RDI->_vptr_acceptor = (_func_int **)&PTR_async_accept_005309b8;
  in_RDI[1]._vptr_acceptor = in_RSI;
  std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
            ((shared_ptr<cppcms::impl::cgi::connection> *)0x49432a);
  this_00 = (acceptor *)(in_RDI + 5);
  piVar1 = cppcms::service::get_io_service((service *)0x494344);
  booster::aio::acceptor::acceptor(this_00,piVar1);
  *(undefined1 *)&in_RDI[0xb]._vptr_acceptor = 0;
  *(undefined1 *)((long)&in_RDI[0xb]._vptr_acceptor + 1) = 0;
  booster::aio::basic_io_device::attach((int)in_RDI + 0x28);
  booster::aio::acceptor::listen((int)in_RDI + 0x28);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(false)
			{
				acceptor_.attach(0);
				acceptor_.listen(backlog);
			}